

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Element::Element(Element *this,Token *key_token,Parser *parser)

{
  TokenList *this_00;
  TokenPtr pTVar1;
  Scope *this_01;
  undefined8 extraout_RAX;
  TokenType TVar2;
  allocator<char> local_51;
  TokenPtr n;
  string local_48;
  
  this->key_token = key_token;
  this_00 = &this->tokens;
  (this->tokens).
  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokens).
  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokens).
  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->compound)._M_t.
  super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
  super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl = (Scope *)0x0;
  n = (TokenPtr)0x0;
  while( true ) {
    n = Parser::AdvanceToNextToken(parser);
    if (n == (TokenPtr)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"unexpected end of file, expected closing bracket",&local_51);
      anon_unknown.dwarf_e47ae8::ParseError(&local_48,parser->last);
      goto LAB_005108e9;
    }
    TVar2 = n->type;
    if (TVar2 == TokenType_DATA) break;
LAB_00510867:
    if (TVar2 == TokenType_OPEN_BRACKET) {
      this_01 = (Scope *)operator_new(0x30);
      Scope::Scope(this_01,parser,false);
      std::__uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>::reset
                ((__uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_> *)
                 &this->compound,this_01);
      n = parser->current;
      if (n->type == TokenType_CLOSE_BRACKET) {
        Parser::AdvanceToNextToken(parser);
        return;
      }
      goto LAB_00510932;
    }
LAB_0051086b:
    if ((TVar2 | TokenType_COMMA) == TokenType_KEY) {
      return;
    }
  }
  std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::push_back
            (this_00,&n);
  pTVar1 = n;
  n = Parser::AdvanceToNextToken(parser);
  if (n != (TokenPtr)0x0) {
    TVar2 = n->type;
    if (TVar2 == TokenType_DATA) {
      if ((pTVar1->type == TokenType_DATA) && (*(int *)&pTVar1->field_3 + 1 == *(int *)&n->field_3))
      {
        std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
        push_back(this_00,&n);
        TVar2 = n->type;
        goto LAB_0051086b;
      }
    }
    else if ((TVar2 & ~TokenType_KEY) == TokenType_OPEN_BRACKET) goto LAB_00510867;
LAB_005108e9:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"unexpected token; expected bracket, comma or key",&local_51);
    anon_unknown.dwarf_e47ae8::ParseError(&local_48,n);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"unexpected end of file, expected bracket, comma or key",&local_51)
  ;
  anon_unknown.dwarf_e47ae8::ParseError(&local_48,parser->last);
LAB_00510932:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"expected closing bracket",&local_51);
  anon_unknown.dwarf_e47ae8::ParseError(&local_48,n);
  std::__cxx11::string::~string((string *)&local_48);
  std::unique_ptr<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>::~unique_ptr
            (&this->compound);
  std::_Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
  ~_Vector_base(&this_00->
                 super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
               );
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Element::Element(const Token& key_token, Parser& parser)
: key_token(key_token)
{
    TokenPtr n = nullptr;
    do {
        n = parser.AdvanceToNextToken();
        if(!n) {
            ParseError("unexpected end of file, expected closing bracket",parser.LastToken());
        }

        if (n->Type() == TokenType_DATA) {
            tokens.push_back(n);
			TokenPtr prev = n;
            n = parser.AdvanceToNextToken();
            if(!n) {
                ParseError("unexpected end of file, expected bracket, comma or key",parser.LastToken());
            }

			const TokenType ty = n->Type();

			// some exporters are missing a comma on the next line
			if (ty == TokenType_DATA && prev->Type() == TokenType_DATA && (n->Line() == prev->Line() + 1)) {
				tokens.push_back(n);
				continue;
			}

            if (ty != TokenType_OPEN_BRACKET && ty != TokenType_CLOSE_BRACKET && ty != TokenType_COMMA && ty != TokenType_KEY) {
                ParseError("unexpected token; expected bracket, comma or key",n);
            }
        }

        if (n->Type() == TokenType_OPEN_BRACKET) {
            compound.reset(new Scope(parser));

            // current token should be a TOK_CLOSE_BRACKET
            n = parser.CurrentToken();
            ai_assert(n);

            if (n->Type() != TokenType_CLOSE_BRACKET) {
                ParseError("expected closing bracket",n);
            }

            parser.AdvanceToNextToken();
            return;
        }
    }
    while(n->Type() != TokenType_KEY && n->Type() != TokenType_CLOSE_BRACKET);
}